

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ReservedRange::Clear(DescriptorProto_ReservedRange *this)

{
  long in_RDI;
  uint32 cached_has_bits;
  
  if ((*(uint *)(in_RDI + 0x10) & 3) != 0) {
    memset((void *)(in_RDI + 0x18),0,8);
  }
  memset((void *)(in_RDI + 0x10),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 8))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear((InternalMetadataWithArena *)(in_RDI + 8));
  }
  return;
}

Assistant:

void DescriptorProto_ReservedRange::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto.ReservedRange)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    ::memset(&start_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&end_) -
        reinterpret_cast<char*>(&start_)) + sizeof(end_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}